

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Traversal.cpp
# Opt level: O1

bool __thiscall
iDynTree::Traversal::addTraversalElement
          (Traversal *this,Link *link,IJoint *jointToParent,Link *parentLink)

{
  pointer *pppLVar1;
  pointer *pppIVar2;
  pointer ppLVar3;
  pointer ppLVar4;
  iterator iVar5;
  iterator __position;
  LinkIndex LVar6;
  Link *local_28;
  IJoint *local_20;
  Link *local_18;
  
  ppLVar3 = (this->links).
            super__Vector_base<const_iDynTree::Link_*,_std::allocator<const_iDynTree::Link_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  ppLVar4 = (this->links).
            super__Vector_base<const_iDynTree::Link_*,_std::allocator<const_iDynTree::Link_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  local_28 = parentLink;
  local_20 = jointToParent;
  local_18 = link;
  LVar6 = Link::getIndex(link);
  (this->linkIndexToTraversalIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[LVar6] = (int)((ulong)((long)ppLVar3 - (long)ppLVar4) >> 3);
  iVar5._M_current =
       (this->links).
       super__Vector_base<const_iDynTree::Link_*,_std::allocator<const_iDynTree::Link_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar5._M_current ==
      (this->links).
      super__Vector_base<const_iDynTree::Link_*,_std::allocator<const_iDynTree::Link_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<iDynTree::Link_const*,std::allocator<iDynTree::Link_const*>>::
    _M_realloc_insert<iDynTree::Link_const*const&>
              ((vector<iDynTree::Link_const*,std::allocator<iDynTree::Link_const*>> *)this,iVar5,
               &local_18);
  }
  else {
    *iVar5._M_current = local_18;
    pppLVar1 = &(this->links).
                super__Vector_base<const_iDynTree::Link_*,_std::allocator<const_iDynTree::Link_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppLVar1 = *pppLVar1 + 1;
  }
  __position._M_current =
       (this->toParentJoints).
       super__Vector_base<const_iDynTree::IJoint_*,_std::allocator<const_iDynTree::IJoint_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->toParentJoints).
      super__Vector_base<const_iDynTree::IJoint_*,_std::allocator<const_iDynTree::IJoint_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<iDynTree::IJoint_const*,std::allocator<iDynTree::IJoint_const*>>::
    _M_realloc_insert<iDynTree::IJoint_const*const&>
              ((vector<iDynTree::IJoint_const*,std::allocator<iDynTree::IJoint_const*>> *)
               &this->toParentJoints,__position,&local_20);
  }
  else {
    *__position._M_current = local_20;
    pppIVar2 = &(this->toParentJoints).
                super__Vector_base<const_iDynTree::IJoint_*,_std::allocator<const_iDynTree::IJoint_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppIVar2 = *pppIVar2 + 1;
  }
  iVar5._M_current =
       (this->parents).
       super__Vector_base<const_iDynTree::Link_*,_std::allocator<const_iDynTree::Link_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar5._M_current ==
      (this->parents).
      super__Vector_base<const_iDynTree::Link_*,_std::allocator<const_iDynTree::Link_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<iDynTree::Link_const*,std::allocator<iDynTree::Link_const*>>::
    _M_realloc_insert<iDynTree::Link_const*const&>
              ((vector<iDynTree::Link_const*,std::allocator<iDynTree::Link_const*>> *)&this->parents
               ,iVar5,&local_28);
  }
  else {
    *iVar5._M_current = local_28;
    pppLVar1 = &(this->parents).
                super__Vector_base<const_iDynTree::Link_*,_std::allocator<const_iDynTree::Link_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppLVar1 = *pppLVar1 + 1;
  }
  return true;
}

Assistant:

bool Traversal::addTraversalElement(const Link* link, const IJoint* jointToParent, const Link* parentLink)
{
    // The traversal index of the link just added will be the current getNrOfVisitedLinks()
    this->linkIndexToTraversalIndex[link->getIndex()] = this->getNrOfVisitedLinks();

    this->links.push_back(link);
    this->toParentJoints.push_back(jointToParent);
    this->parents.push_back(parentLink);

    return true;
}